

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O0

wchar_t count_feats(loc *grid,_func__Bool_chunk_ptr_loc *test,_Bool under)

{
  _Bool _Var1;
  loc_conflict grid_00;
  wchar_t local_2c;
  wchar_t count;
  loc grid1;
  wchar_t d;
  _Bool under_local;
  _func__Bool_chunk_ptr_loc *test_local;
  loc *grid_local;
  
  local_2c = L'\0';
  for (grid1.x = 0; grid1.x < 9; grid1.x = grid1.x + 1) {
    if ((grid1.x != 8) || (under)) {
      grid_00 = (loc_conflict)loc_sum(player->grid,ddgrid_ddd[grid1.x]);
      _Var1 = square_in_bounds_fully((chunk *)cave,grid_00);
      if ((_Var1) &&
         (((_Var1 = square_isknown((chunk *)cave,grid_00), _Var1 &&
           (_Var1 = (*test)((chunk_conflict *)player->cave,(loc)grid_00), _Var1)) &&
          (local_2c = local_2c + L'\x01', grid != (loc *)0x0)))) {
        grid->x = grid_00.x;
        grid->y = grid_00.y;
      }
    }
  }
  return local_2c;
}

Assistant:

int count_feats(struct loc *grid,
				bool (*test)(struct chunk *c, struct loc grid), bool under)
{
	int d;
	struct loc grid1;
	int count = 0; /* Count how many matches */

	/* Check around (and under) the character */
	for (d = 0; d < 9; d++) {
		/* if not searching under player continue */
		if ((d == 8) && !under) continue;

		/* Extract adjacent (legal) location */
		grid1 = loc_sum(player->grid, ddgrid_ddd[d]);

		/* Paranoia */
		if (!square_in_bounds_fully(cave, grid1)) continue;

		/* Must have knowledge */
		if (!square_isknown(cave, grid1)) continue;

		/* Not looking for this feature; test against player's memory */
		if (!((*test)(player->cave, grid1))) continue;

		/* Count it */
		++count;

		/* Remember the location of the last match */
		if (grid) {
			*grid = grid1;
		}
	}

	/* All done */
	return count;
}